

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# benchmarking.h
# Opt level: O0

void __thiscall
benchmark_data::benchmark_data
          (benchmark_data *this,char *i_name,int w,int h,char *f_name,int n_ipoints,long n_flops)

{
  undefined4 in_ECX;
  undefined4 in_EDX;
  char *in_RSI;
  char *in_RDI;
  char *in_R8;
  undefined4 in_R9D;
  undefined8 in_stack_00000008;
  
  *(undefined4 *)(in_RDI + 0x100) = in_EDX;
  *(undefined4 *)(in_RDI + 0x104) = in_ECX;
  *(undefined4 *)(in_RDI + 0x208) = in_R9D;
  *(undefined8 *)(in_RDI + 0x210) = in_stack_00000008;
  in_RDI[0x218] = '\0';
  in_RDI[0x219] = '\0';
  in_RDI[0x21a] = '\0';
  in_RDI[0x21b] = '\0';
  in_RDI[0x21c] = '\0';
  in_RDI[0x21d] = '\0';
  in_RDI[0x21e] = '\0';
  in_RDI[0x21f] = '\0';
  in_RDI[0x220] = '\0';
  in_RDI[0x221] = '\0';
  in_RDI[0x222] = '\0';
  in_RDI[0x223] = '\0';
  in_RDI[0x224] = '\0';
  in_RDI[0x225] = '\0';
  in_RDI[0x226] = '\0';
  in_RDI[0x227] = '\0';
  in_RDI[0x228] = '\0';
  in_RDI[0x229] = '\0';
  in_RDI[0x22a] = '\0';
  in_RDI[0x22b] = '\0';
  in_RDI[0x22c] = '\0';
  in_RDI[0x22d] = '\0';
  in_RDI[0x22e] = '\0';
  in_RDI[0x22f] = '\0';
  in_RDI[0x230] = '\0';
  in_RDI[0x231] = '\0';
  in_RDI[0x232] = '\0';
  in_RDI[0x233] = '\0';
  in_RDI[0x234] = '\0';
  in_RDI[0x235] = '\0';
  in_RDI[0x236] = '\0';
  in_RDI[0x237] = '\0';
  strncpy(in_RDI,in_RSI,0x100);
  strncpy(in_RDI + 0x108,in_R8,0x100);
  return;
}

Assistant:

benchmark_data(char *i_name, int w, int h, char *f_name, int n_ipoints, long n_flops)
        : width(w),
          height(h),
          num_interest_points(n_ipoints),
          num_flops(n_flops),
          avg_cycles(0),
          min_cycles(0),
          max_cycles(0),
          flops_per_cycle(0.0) {
        // Copying image and function name strings into struct
        strncpy(image_name, i_name, 256);
        strncpy(function_name, f_name, 256);
    }